

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::JSONParser::ParseOptNameStringValue(JSONParser *this,string *out_string)

{
  bool bVar1;
  Result RVar2;
  string *out_string_local;
  JSONParser *this_local;
  
  std::__cxx11::string::clear();
  bVar1 = Match(this,"\"name\"");
  if (bVar1) {
    RVar2 = Expect(this,":");
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    RVar2 = ParseString(this,out_string);
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    RVar2 = Expect(this,",");
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseOptNameStringValue(std::string* out_string) {
  out_string->clear();
  if (Match("\"name\"")) {
    EXPECT(":");
    CHECK_RESULT(ParseString(out_string));
    EXPECT(",");
  }
  return wabt::Result::Ok;
}